

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_file_getByte(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  FILE *__stream;
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue JVar3;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  if (__stream == (FILE *)0x0) {
    iVar2 = 6;
    JVar1.float64 = 0.0;
  }
  else {
    JVar1._0_4_ = fgetc(__stream);
    JVar1._4_4_ = 0;
    iVar2 = 0;
  }
  JVar3.tag = iVar2;
  JVar3.u.float64 = JVar1.float64;
  return JVar3;
}

Assistant:

static JSValue js_std_file_getByte(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    if (!f)
        return JS_EXCEPTION;
    return JS_NewInt32(ctx, fgetc(f));
}